

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

bool EV_OpenPolyDoor(line_t *line,int polyNum,double speed,DAngle *angle,int delay,double distance,
                    podoortype_t type)

{
  double dVar1;
  FPolyObj *poly;
  DPolyAction *pDVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  FPolyMirrorIterator it;
  TAngle<double> local_1e0;
  DObject *local_1d8;
  FPolyMirrorIterator local_1d0;
  
  lVar3 = (long)po_NumPolyobjs;
  local_1d0.CurPoly = polyobjs;
  if (0 < lVar3) {
    do {
      if ((local_1d0.CurPoly)->tag == polyNum) goto LAB_00560576;
      lVar3 = lVar3 + -1;
      local_1d0.CurPoly = local_1d0.CurPoly + 1;
    } while (lVar3 != 0);
  }
  local_1d0.CurPoly = (FPolyObj *)0x0;
LAB_00560576:
  if (local_1d0.CurPoly == (FPolyObj *)0x0) {
    Printf("EV_OpenPolyDoor: Invalid polyobj num: %d\n");
  }
  else {
    local_1d0.UsedPolys[0] = (local_1d0.CurPoly)->tag;
    local_1d0.NumUsedPolys = 1;
    poly = FPolyMirrorIterator::NextMirror(&local_1d0);
    if (poly != (FPolyObj *)0x0) {
      iVar4 = 1;
      bVar5 = false;
      do {
        pDVar2 = (poly->specialdata).field_0.p;
        if (pDVar2 != (DPolyAction *)0x0) {
          if (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            return bVar5;
          }
          (poly->specialdata).field_0.p = (DPolyAction *)0x0;
        }
        if (poly->bBlocked != false) {
          return bVar5;
        }
        if ((type == PODOOR_SWING) && (poly->bHasPortals == '\x02')) {
          return bVar5;
        }
        pDVar2 = (DPolyAction *)
                 M_Malloc_Dbg(0x90,
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                              ,0x1f7);
        DPolyAction::DPolyAction(pDVar2,poly->tag);
        pDVar2[1].super_DThinker.super_DObject._vptr_DObject = (_func_int **)0x0;
        pDVar2[1].super_DThinker.super_DObject.Class = (PClass *)0x0;
        pDVar2[1].super_DThinker.super_DObject.ObjNext = (DObject *)0x0;
        (pDVar2->super_DThinker).super_DObject._vptr_DObject =
             (_func_int **)&PTR_StaticType_0084c110;
        *(podoortype_t *)&pDVar2[1].super_DThinker.PrevThinker = type;
        *(undefined1 *)((long)&pDVar2[1].super_DThinker.PrevThinker + 4) = 0;
        pDVar2[1].super_DThinker.super_DObject.GCNext = (DObject *)0x0;
        *(undefined8 *)&pDVar2[1].super_DThinker.super_DObject.ObjectFlags = 0;
        pDVar2[1].super_DThinker.NextThinker = (DThinker *)0x0;
        (poly->specialdata).field_0.p = pDVar2;
        if (type == PODOOR_SLIDE) {
          *(int *)((long)&pDVar2[1].super_DThinker.NextThinker + 4) = delay;
          pDVar2->m_Speed = speed;
          *(double *)&pDVar2[1].super_DThinker.super_DObject.ObjectFlags = distance;
          pDVar2->m_Dist = distance;
          pDVar2[1].super_DThinker.super_DObject.GCNext = (DObject *)angle->Degrees;
          TAngle<double>::ToVector(&local_1e0,speed);
          pDVar2[1].super_DThinker.super_DObject.ObjNext = local_1d8;
          pDVar2[1].super_DThinker.super_DObject.Class = (PClass *)local_1e0.Degrees;
          SN_StartSequence(poly,poly->seqType,SEQ_DOOR,0,false);
          angle->Degrees = angle->Degrees + 180.0;
        }
        else if (type == PODOOR_SWING) {
          *(int *)((long)&pDVar2[1].super_DThinker.NextThinker + 4) = delay;
          pDVar2[1].super_DThinker.super_DObject.GCNext = (DObject *)(double)iVar4;
          pDVar2->m_Speed = (double)iVar4 * speed * 1.40625 * 0.125;
          dVar1 = angle->Degrees;
          *(double *)&pDVar2[1].super_DThinker.super_DObject.ObjectFlags = dVar1;
          pDVar2->m_Dist = dVar1;
          SN_StartSequence(poly,poly->seqType,SEQ_DOOR,0,false);
          iVar4 = -iVar4;
        }
        poly = FPolyMirrorIterator::NextMirror(&local_1d0);
        bVar5 = true;
      } while (poly != (FPolyObj *)0x0);
      return true;
    }
  }
  return false;
}

Assistant:

bool EV_OpenPolyDoor(line_t *line, int polyNum, double speed, DAngle angle, int delay, double distance, podoortype_t type)
{
	DPolyDoor *pd = NULL;
	FPolyObj *poly;
	int swingdir = 1;	// ADD:  PODOOR_SWINGL, PODOOR_SWINGR

	if ((poly = PO_GetPolyobj(polyNum)) == NULL)
	{
		Printf("EV_OpenPolyDoor: Invalid polyobj num: %d\n", polyNum);
		return false;
	}
	FPolyMirrorIterator it(poly);

	while ((poly = it.NextMirror()) != NULL)
	{
		if ((poly->specialdata != NULL || poly->bBlocked))
		{ // poly is already moving
			break;
		}
		if (poly->bHasPortals == 2 && type == PODOOR_SWING)
		{
			// cannot do rotations on linked polyportals.
			break;
		}

		pd = new DPolyDoor(poly->tag, type);
		poly->specialdata = pd;
		if (type == PODOOR_SLIDE)
		{
			pd->m_WaitTics = delay;
			pd->m_Speed = speed;
			pd->m_Dist = pd->m_TotalDist = distance; // Distance
			pd->m_Direction = angle;
			pd->m_Speedv = angle.ToVector(speed);
			SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);
			angle += 180.;	// reverse the angle
		}
		else if (type == PODOOR_SWING)
		{
			pd->m_WaitTics = delay;
			pd->m_Direction.Degrees = swingdir; 
			pd->m_Speed = (speed*swingdir*(90. / 64)) / 8;
			pd->m_Dist = pd->m_TotalDist = angle.Degrees;
			SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);
			swingdir = -swingdir;	// reverse the direction
		}

	}
	return pd != NULL;	// Return true if something started moving.
}